

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_db.c
# Opt level: O3

cfg_entry *
cfg_db_set_entry_ext
          (cfg_db *db,char *section_type,char *section_name,char *entry_name,char *value,
          _Bool append,_Bool front)

{
  int iVar1;
  cfg_named_section *named;
  cfg_entry *pcVar2;
  cfg_entry *entry;
  char *pcVar3;
  _Bool new_section;
  _Bool local_39;
  char *local_38;
  
  local_39 = false;
  named = _cfg_db_add_section(db,section_type,section_name,&local_39);
  if (named == (cfg_named_section *)0x0) {
    return (cfg_entry *)0x0;
  }
  local_38 = value;
  pcVar2 = (cfg_entry *)avl_find(&named->entries,entry_name);
  entry = pcVar2;
  if (pcVar2 == (cfg_entry *)0x0) {
    if (entry_name == (char *)0x0) {
      __assert_fail("name",
                    "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/libconfig/cfg_db.c"
                    ,0x23c,
                    "struct cfg_entry *_alloc_entry(struct cfg_named_section *, const char *)");
    }
    entry = (cfg_entry *)calloc(1,0x58);
    if (entry == (cfg_entry *)0x0) goto LAB_001288d1;
    pcVar3 = strdup(entry_name);
    entry->name = pcVar3;
    if (pcVar3 == (char *)0x0) {
      free(entry);
      goto LAB_001288d1;
    }
    (entry->node).key = pcVar3;
    avl_insert(&named->entries,(avl_node *)entry);
    entry->named_section = named;
  }
  if (!append) {
    free((entry->val).value);
    (entry->val).value = (char *)0x0;
    (entry->val).length = 0;
  }
  if (front) {
    iVar1 = strarray_prepend(&entry->val,local_38);
  }
  else {
    iVar1 = strarray_append(&entry->val,local_38);
  }
  if (iVar1 == 0) {
    return entry;
  }
  if (pcVar2 == (cfg_entry *)0x0) {
    _free_entry(entry);
  }
LAB_001288d1:
  if (local_39 == true) {
    _free_namedsection(named);
  }
  return (cfg_entry *)0x0;
}

Assistant:

struct cfg_entry *
cfg_db_set_entry_ext(struct cfg_db *db, const char *section_type, const char *section_name, const char *entry_name,
  const char *value, bool append, bool front) {
  struct cfg_entry *entry;
  struct cfg_named_section *named;
  bool new_section = false, new_entry = NULL;

  /* create section */
  named = _cfg_db_add_section(db, section_type, section_name, &new_section);
  if (!named) {
    return NULL;
  }

  /* get entry */
  entry = avl_find_element(&named->entries, entry_name, entry, node);
  if (!entry) {
    entry = _alloc_entry(named, entry_name);
    if (!entry) {
      goto set_entry_error;
    }
    new_entry = true;
  }

  if (!append) {
    strarray_free(&entry->val);
  }
  /* prepend new entry */
  if (front) {
    if (strarray_prepend(&entry->val, value)) {
      goto set_entry_error;
    }
  }
  else {
    if (strarray_append(&entry->val, value)) {
      goto set_entry_error;
    }
  }

  return entry;
set_entry_error:
  if (new_entry) {
    _free_entry(entry);
  }
  if (new_section) {
    _free_namedsection(named);
  }
  return NULL;
}